

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttload.c
# Opt level: O0

FT_Error tt_face_goto_table(TT_Face face,FT_ULong tag,FT_Stream stream,FT_ULong *length)

{
  TT_Table pTVar1;
  FT_Error local_34;
  FT_Error error;
  TT_Table table;
  FT_ULong *length_local;
  FT_Stream stream_local;
  FT_ULong tag_local;
  TT_Face face_local;
  
  pTVar1 = tt_face_lookup_table(face,tag);
  if (pTVar1 == (TT_Table)0x0) {
    local_34 = 0x8e;
  }
  else {
    if (length != (FT_ULong *)0x0) {
      *length = pTVar1->Length;
    }
    local_34 = FT_Stream_Seek(stream,pTVar1->Offset);
  }
  return local_34;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_goto_table( TT_Face    face,
                      FT_ULong   tag,
                      FT_Stream  stream,
                      FT_ULong*  length )
  {
    TT_Table  table;
    FT_Error  error;


    table = tt_face_lookup_table( face, tag );
    if ( table )
    {
      if ( length )
        *length = table->Length;

      if ( FT_STREAM_SEEK( table->Offset ) )
        goto Exit;
    }
    else
      error = FT_THROW( Table_Missing );

  Exit:
    return error;
  }